

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aiman.h
# Opt level: O0

void server::aiman::checkai(void)

{
  bool bVar1;
  int iVar2;
  
  if ((dorefresh & 1) != 0) {
    dorefresh = 0;
    if ((((gamemode < -3) || (0x16 < gamemode)) || ((gamemodes[gamemode + 3].flags & 0x6000U) != 0))
       || (iVar2 = numclients(-1,false,true,false), iVar2 == 0)) {
      clearai();
    }
    else {
      checksetup();
      do {
        bVar1 = reassignai();
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void checkai()
    {
        if(!dorefresh) return;
        dorefresh = false;
        if(m_botmode && numclients(-1, false, true))
        {
            checksetup();
            while(reassignai());
        }
        else clearai();
    }